

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O2

void __thiscall mp::QP2Passes::Process(QP2Passes *this,Expr expr)

{
  bool bVar1;
  ExprBase EVar2;
  
  EVar2.impl_ = (Impl *)0x0;
  if (*(int *)expr.super_ExprBase.impl_ - 0x2aU < 4) {
    EVar2.impl_ = (Impl *)expr.super_ExprBase.impl_;
  }
  (this->top_expr_).super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_ =
       EVar2.impl_;
  RunPass1(this);
  bVar1 = Pass2SeemsWorth(this);
  if (bVar1) {
    RunPass2Full(this);
    return;
  }
  RunPass2Buckets(this);
  return;
}

Assistant:

void QP2Passes::Process(Expr expr) {
  assert(expr::Kind::SUM == expr.kind());             //for now
  top_expr_ = Cast<internal::ExprTypes::SumExpr>(expr);
  RunPass1();
  if (Pass2SeemsWorth())
    RunPass2Full();
  else
    RunPass2Buckets();
}